

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-example.cc
# Opt level: O2

string * __thiscall
ExprPrinter::format<std::__cxx11::string>
          (string *__return_storage_ptr__,ExprPrinter *this,char *format_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  BasicStringRef<char> value;
  BasicWriter<char> *this_00;
  MemoryWriter *this_01;
  BasicStringRef<char> value_00;
  int local_24;
  
  this->next_expr_id_ = this->next_expr_id_ + 1;
  fmt::format<int>(__return_storage_ptr__,(CStringRef)0x12d0ec,&local_24);
  this_01 = &this->output_;
  value.data_ = (__return_storage_ptr__->_M_dataplus)._M_p;
  value.size_ = __return_storage_ptr__->_M_string_length;
  this_00 = fmt::BasicWriter<char>::operator<<(&this_01->super_BasicWriter<char>,value);
  value_00.size_ = 3;
  value_00.data_ = " = ";
  fmt::BasicWriter<char>::operator<<(this_00,value_00);
  fmt::BasicWriter<char>::write<std::__cxx11::string>
            (&this_01->super_BasicWriter<char>,(BasicCStringRef<char>)format_str,args);
  fmt::BasicWriter<char>::operator<<(&this_01->super_BasicWriter<char>,'\n');
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char *format_str, const T &... args) {
    std::string id = fmt::format("e{}", next_expr_id_++);
    output_ << id << " = ";
    output_.write(format_str, args...);
    output_ << '\n';
    return id;
  }